

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

String * __thiscall kj::TaskSet::trace(String *__return_storage_ptr__,TaskSet *this)

{
  Task *this_00;
  char *in_RCX;
  Maybe<kj::Own<kj::TaskSet::Task,_kj::_::PromiseDisposer>_> *pMVar1;
  Vector<kj::String> traces;
  ArrayBuilder<kj::String> local_58;
  Array<char> local_38;
  
  local_58.ptr = (String *)0x0;
  local_58.pos = (RemoveConst<kj::String> *)0x0;
  local_58.endPtr = (String *)0x0;
  local_58.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  for (pMVar1 = &this->tasks; this_00 = (pMVar1->ptr).ptr, this_00 != (Task *)0x0;
      pMVar1 = &((pMVar1->ptr).ptr)->next) {
    Task::trace((String *)&local_38,this_00);
    Vector<kj::String>::add<kj::String>((Vector<kj::String> *)&local_58,(String *)&local_38);
    Array<char>::~Array(&local_38);
  }
  strArray<kj::Vector<kj::String>&>
            (__return_storage_ptr__,(kj *)&local_58,(Vector<kj::String> *)0x43bb8d,in_RCX);
  ArrayBuilder<kj::String>::dispose(&local_58);
  return __return_storage_ptr__;
}

Assistant:

kj::String TaskSet::trace() {
  kj::Vector<kj::String> traces;

  Maybe<OwnTask>* ptr = &tasks;
  for (;;) {
    KJ_IF_SOME(task, *ptr) {
      traces.add(task->trace());
      ptr = &task->next;
    } else {
      break;
    }
  }